

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter.cpp
# Opt level: O2

TRIPLEYCbCr ** __thiscall
MovingAveradgeFilter::apply_filter
          (MovingAveradgeFilter *this,TRIPLEYCbCr **mrx,int h,int w,int radius,double sigma)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  TRIPLEYCbCr **mrxf;
  TRIPLEYCbCr *pTVar3;
  TRIPLEYCbCr *this_00;
  int i;
  int row;
  ulong uVar4;
  int j;
  int col;
  
  uVar4 = 0;
  this_00 = (TRIPLEYCbCr *)((ulong)(uint)h << 3);
  if (h < 0) {
    this_00 = (TRIPLEYCbCr *)0xffffffffffffffff;
  }
  uVar2 = 0;
  if (0 < h) {
    uVar2 = (ulong)(uint)h;
  }
  mrxf = (TRIPLEYCbCr **)operator_new__((ulong)this_00);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)w;
  pTVar3 = SUB168(auVar1 * ZEXT816(3),0);
  if (SUB168(auVar1 * ZEXT816(3),8) != 0) {
    pTVar3 = (TRIPLEYCbCr *)0xffffffffffffffff;
  }
  for (; uVar2 != uVar4; uVar4 = uVar4 + 1) {
    this_00 = (TRIPLEYCbCr *)operator_new__((ulong)pTVar3);
    mrxf[uVar4] = this_00;
    memset(this_00,0,(long)w * 3);
  }
  row = radius;
  while( true ) {
    col = radius;
    if (h - radius <= row) break;
    for (; col < w - radius; col = col + 1) {
      moving_averadge((MovingAveradgeFilter *)this_00,mrxf,mrx,row,col,radius);
    }
    row = row + 1;
  }
  return mrxf;
}

Assistant:

TRIPLEYCbCr **MovingAveradgeFilter::apply_filter(TRIPLEYCbCr **mrx, int h, int w, int radius, double sigma) {
    TRIPLEYCbCr **mrxf = new TRIPLEYCbCr *[h];
    for (int i = 0; i < h; i++) {
        mrxf[i] = new TRIPLEYCbCr[w];
        memset(mrxf[i], 0, sizeof(TRIPLEYCbCr) * w);
    }
    for (int i = radius; i < h - radius; i++) {
        for (int j = radius; j < w - radius; j++) {
            moving_averadge(&mrxf[0], mrx, i, j, radius);
        }
    }
    return mrxf;
}